

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginMainMenuBar(void)

{
  undefined8 uVar1;
  ImVec2 IVar2;
  bool bVar3;
  bool bVar4;
  float _y;
  undefined1 auVar5 [64];
  bool is_open;
  ImGuiWindowFlags window_flags;
  ImVec2 menu_bar_size;
  ImVec2 menu_bar_pos;
  ImGuiWindow *menu_bar_window;
  ImGuiViewportP *viewport;
  ImGuiContext *g;
  ImGuiWindowFlags in_stack_00000384;
  bool *in_stack_00000388;
  char *in_stack_00000390;
  ImVec2 *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  float _x;
  float local_58;
  float in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  uint uVar6;
  undefined4 in_stack_ffffffffffffffb4;
  int count;
  ImVec2 local_48;
  float in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  ImVec2 in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  ImGuiStyleVar idx;
  ImVec2 local_28;
  ImGuiWindow *local_20;
  ImGuiViewport *local_18;
  ImGuiContext *local_10;
  undefined1 extraout_var [56];
  
  idx = (ImGuiStyleVar)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  local_10 = GImGui;
  local_18 = GetMainViewport();
  local_20 = FindWindowByName((char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))
  ;
  _x = (local_10->Style).DisplaySafeAreaPadding.x;
  _y = ImMax<float>((local_10->Style).DisplaySafeAreaPadding.y - (local_10->Style).FramePadding.y,
                    0.0);
  ImVec2::ImVec2(&local_28,_x,_y);
  (local_10->NextWindowData).MenuBarOffsetMinVal = local_28;
  if ((local_20 == (ImGuiWindow *)0x0) || (local_20->BeginCount == 0)) {
    auVar5._0_8_ = ::operator+(in_stack_ffffffffffffff98,(ImVec2 *)0x20005e);
    auVar5._8_56_ = extraout_var;
    uVar1 = vmovlpd_avx(auVar5._0_16_);
    idx = (ImGuiStyleVar)((ulong)uVar1 >> 0x20);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffc8,
                   ((local_18->Size).x - local_18[4].Size.y) + local_18[4].WorkPos.y,1.0);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffc0,0.0,0.0);
    SetNextWindowPos((ImVec2 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     (ImGuiCond)in_stack_ffffffffffffffac,
                     (ImVec2 *)CONCAT44(_x,in_stack_ffffffffffffffa0));
    SetNextWindowSize((ImVec2 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      (ImGuiCond)in_stack_ffffffffffffffac);
  }
  PushStyleVar((ImGuiStyleVar)in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
  ImVec2::ImVec2(&local_48,0.0,0.0);
  PushStyleVar(idx,(ImVec2 *)in_stack_ffffffffffffffc8);
  count = 0x50f;
  bVar3 = Begin(in_stack_00000390,in_stack_00000388,in_stack_00000384);
  bVar4 = false;
  if (bVar3) {
    bVar4 = BeginMenuBar();
  }
  uVar6 = (uint)bVar4 << 0x18;
  PopStyleVar(count);
  local_20 = GetCurrentWindow();
  if (local_20->BeginCount == 1) {
    local_18[4].WorkPos.x = (local_20->Size).y + local_18[4].WorkPos.x;
  }
  ImVec2::ImVec2((ImVec2 *)&local_58,0.0,0.0);
  IVar2.y = in_stack_ffffffffffffffac;
  IVar2.x = local_58;
  (local_10->NextWindowData).MenuBarOffsetMinVal = IVar2;
  bVar3 = (uVar6 & 0x1000000) != 0;
  if (!bVar3) {
    End();
  }
  return bVar3;
}

Assistant:

bool ImGui::BeginMainMenuBar()
{
    ImGuiContext& g = *GImGui;
    ImGuiViewportP* viewport = (ImGuiViewportP*)(void*)GetMainViewport();
    ImGuiWindow* menu_bar_window = FindWindowByName("##MainMenuBar");

    // For the main menu bar, which cannot be moved, we honor g.Style.DisplaySafeAreaPadding to ensure text can be visible on a TV set.
    g.NextWindowData.MenuBarOffsetMinVal = ImVec2(g.Style.DisplaySafeAreaPadding.x, ImMax(g.Style.DisplaySafeAreaPadding.y - g.Style.FramePadding.y, 0.0f));

    // Get our rectangle at the top of the work area
    if (menu_bar_window == NULL || menu_bar_window->BeginCount == 0)
    {
        // Set window position
        // We don't attempt to calculate our height ahead, as it depends on the per-viewport font size. 
        // However menu-bar will affect the minimum window size so we'll get the right height.
        ImVec2 menu_bar_pos = viewport->Pos + viewport->CurrWorkOffsetMin;
        ImVec2 menu_bar_size = ImVec2(viewport->Size.x - viewport->CurrWorkOffsetMin.x + viewport->CurrWorkOffsetMax.x, 1.0f);
        SetNextWindowPos(menu_bar_pos);
        SetNextWindowSize(menu_bar_size);
    }

    // Create window
    PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
    PushStyleVar(ImGuiStyleVar_WindowMinSize, ImVec2(0, 0)); // Lift normal size constraint, however the presence of a menu-bar will give us the minimum height we want.
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoScrollbar | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_MenuBar;
    bool is_open = Begin("##MainMenuBar", NULL, window_flags) && BeginMenuBar();
    PopStyleVar(2);

    // Report our size into work area (for next frame) using actual window size
    menu_bar_window = GetCurrentWindow();
    if (menu_bar_window->BeginCount == 1)
        viewport->CurrWorkOffsetMin.y += menu_bar_window->Size.y;

    g.NextWindowData.MenuBarOffsetMinVal = ImVec2(0.0f, 0.0f);
    if (!is_open)
    {
        End();
        return false;
    }
    return true; //-V1020
}